

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::TranslatePath(ClipperLib *this,Path *input,Path *output,IntPoint delta)

{
  long lVar1;
  _Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *p_Var2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  IntPoint local_40;
  ulong local_30;
  size_t i;
  Path *output_local;
  Path *input_local;
  IntPoint delta_local;
  
  delta_local.X = delta.X;
  i = (size_t)input;
  output_local = (Path *)this;
  input_local = output;
  sVar4 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size
                    ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)this);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::resize(input,sVar4);
  local_30 = 0;
  while( true ) {
    uVar3 = local_30;
    sVar4 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size
                      (output_local);
    if (sVar4 <= uVar3) break;
    pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (output_local,local_30);
    lVar1 = pvVar5->X;
    p_Var2 = &input_local->
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>;
    pvVar5 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       (output_local,local_30);
    IntPoint::IntPoint(&local_40,(long)&(p_Var2->_M_impl).super__Vector_impl_data._M_start + lVar1,
                       pvVar5->Y + delta_local.X);
    pvVar6 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                       ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)i,
                        local_30);
    pvVar6->X = local_40.X;
    pvVar6->Y = local_40.Y;
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void TranslatePath(const Path& input, Path& output, const IntPoint delta)
{
  //precondition: input != output
  output.resize(input.size());
  for (size_t i = 0; i < input.size(); ++i)
    output[i] = IntPoint(input[i].X + delta.X, input[i].Y + delta.Y);
}